

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::get_hash_for_graphics_pipeline_handle
          (StateRecorder *this,VkPipeline pipeline,Hash *hash)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  __node_base_ptr p_Var4;
  __node_base_ptr p_Var5;
  _Hash_node_base *p_Var6;
  long *in_FS_OFFSET;
  
  uVar1 = (this->impl->graphics_pipeline_to_hash)._M_h._M_bucket_count;
  uVar3 = (ulong)pipeline % uVar1;
  p_Var4 = (this->impl->graphics_pipeline_to_hash)._M_h._M_buckets[uVar3];
  p_Var5 = (__node_base_ptr)0x0;
  if ((p_Var4 != (__node_base_ptr)0x0) &&
     (p_Var6 = p_Var4->_M_nxt, p_Var5 = p_Var4, (VkPipeline)p_Var4->_M_nxt[1]._M_nxt != pipeline)) {
    while (p_Var4 = p_Var6, p_Var6 = p_Var4->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
      p_Var5 = (__node_base_ptr)0x0;
      if (((ulong)p_Var6[1]._M_nxt % uVar1 != uVar3) ||
         (p_Var5 = p_Var4, (VkPipeline)p_Var6[1]._M_nxt == pipeline)) goto LAB_001121a5;
    }
    p_Var5 = (__node_base_ptr)0x0;
  }
LAB_001121a5:
  if (p_Var5 == (__node_base_ptr)0x0) {
    p_Var6 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var6 = p_Var5->_M_nxt;
  }
  if (p_Var6 == (_Hash_node_base *)0x0) {
    if ((*(int *)(*in_FS_OFFSET + -0x18) < 2) &&
       (bVar2 = Internal::log_thread_callback
                          (LOG_DEFAULT,
                           "%s handle 0x%016lx is not registered.\nIt has either not been recorded, or it failed to be recorded earlier (which is expected if application uses an extension that is not recognized by Fossilize).\n"
                           ,"Graphics pipeline",pipeline), !bVar2)) {
      fprintf(_stderr,
              "Fossilize WARN: %s handle 0x%016lx is not registered.\nIt has either not been recorded, or it failed to be recorded earlier (which is expected if application uses an extension that is not recognized by Fossilize).\n"
              ,"Graphics pipeline",pipeline);
    }
  }
  else {
    *hash = (Hash)p_Var6[2]._M_nxt;
  }
  return p_Var6 != (_Hash_node_base *)0x0;
}

Assistant:

bool StateRecorder::get_hash_for_graphics_pipeline_handle(VkPipeline pipeline, Hash *hash) const
{
	auto itr = impl->graphics_pipeline_to_hash.find(pipeline);
	if (itr == end(impl->graphics_pipeline_to_hash))
	{
		log_failed_hash("Graphics pipeline", pipeline);
		return false;
	}
	else
	{
		*hash = itr->second;
		return true;
	}
}